

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>::
CopyNodes(TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
          *this,Node *nodes,hash_t numnodes)

{
  bool bVar1;
  FName local_2c;
  Node *local_28;
  Node *n;
  Node *pNStack_18;
  hash_t numnodes_local;
  Node *nodes_local;
  TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
  *this_local;
  
  n._4_4_ = numnodes;
  pNStack_18 = nodes;
  nodes_local = (Node *)this;
  while (n._4_4_ != 0) {
    n._4_4_ = n._4_4_ - 1;
    bVar1 = Node::IsNil(pNStack_18);
    if (!bVar1) {
      FName::FName(&local_2c,&(pNStack_18->Pair).Key);
      local_28 = NewKey(this,&local_2c);
      FOptionalMapinfoDataPtr::FOptionalMapinfoDataPtr
                (&(local_28->Pair).Value,&(pNStack_18->Pair).Value);
    }
    pNStack_18 = pNStack_18 + 1;
  }
  return;
}

Assistant:

void CopyNodes(const Node *nodes, hash_t numnodes)
	{
		for (; numnodes-- > 0; ++nodes)
		{
			if (!nodes->IsNil())
			{
				Node *n = NewKey(nodes->Pair.Key);
				::new(&n->Pair.Value) VT(nodes->Pair.Value);
			}
		}
	}